

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproxy.cpp
# Opt level: O0

void log_device_awake(uchar *ip_address,uchar *mac_address)

{
  size_t in_RCX;
  void *__buf;
  string ip_address_str;
  string mac_address_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *ip_str;
  uchar *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  uchar *in_stack_ffffffffffffff30;
  string local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string local_a0 [32];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_30;
  
  ip_str = &local_30;
  std::__cxx11::string::string((string *)ip_str);
  mac_to_string(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  __rhs = &local_60;
  std::__cxx11::string::string((string *)__rhs);
  ip_to_string(in_stack_ffffffffffffff20,ip_str);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::operator+(ip_str,(char *)__rhs);
  std::operator+(ip_str,__rhs);
  std::operator+(ip_str,(char *)__rhs);
  Log::write(&log,(int)local_80,__buf,in_RCX);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void log_device_awake(const unsigned char* const ip_address,
                      const unsigned char* const mac_address)
{
  // Parse mac into string
  std::string mac_address_str;
  mac_to_string(mac_address, mac_address_str);

  // Parse IP address into string
  std::string ip_address_str;
  ip_to_string(ip_address, ip_address_str);

  // Issue the log message
  log.write("Device " + mac_address_str + " (" + ip_address_str + ") is awake");
}